

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O3

float ImNodes::GetDistanceToLineSquared(ImVec2 *point,ImVec2 *a,ImVec2 *b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar1 = a->x;
  fVar2 = a->y;
  fVar4 = b->x - fVar1;
  fVar6 = b->y - fVar2;
  fVar3 = ((point->x - fVar1) * fVar4 + (point->y - fVar2) * fVar6) /
          (fVar4 * fVar4 + fVar6 * fVar6);
  fVar5 = 1.0;
  if ((fVar3 <= 1.0) && (fVar5 = fVar3, fVar3 < 0.0)) {
    fVar5 = 0.0;
  }
  fVar1 = (fVar4 * fVar5 + fVar1) - point->x;
  fVar2 = (fVar6 * fVar5 + fVar2) - point->y;
  return fVar1 * fVar1 + fVar2 * fVar2;
}

Assistant:

float GetDistanceToLineSquared(const ImVec2& point, const ImVec2& a, const ImVec2& b)
{
    float tx, ty, t, u;
    tx = b.x - a.x;
    ty = b.y - a.y;
    t = (tx * tx) + (ty * ty);
    u = ((point.x - a.x) * tx + (point.y - a.y) * ty) / t;
    if (u > 1)
        u = 1;
    else if (u < 0)
        u = 0;
    tx = (a.x + u * tx) - point.x;
    ty = (a.y + u * ty) - point.y;
    return tx * tx + ty * ty;
}